

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chunk.cpp
# Opt level: O1

vector<char,_std::allocator<char>_> * __thiscall
Chunk::serialize(vector<char,_std::allocator<char>_> *__return_storage_ptr__,Chunk *this)

{
  char *pcVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  bool bVar27;
  pointer __s;
  long lVar28;
  value_type *__val;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  
  bVar27 = isEmpty(this);
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (!bVar27) {
    __s = (pointer)operator_new(0x1000);
    (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
    super__Vector_impl_data._M_start = __s;
    (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
    super__Vector_impl_data._M_finish = __s;
    (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = __s + 0x1000;
    lVar28 = 0;
    memset(__s,0,0x1000);
    (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
    super__Vector_impl_data._M_finish = __s + 0x1000;
    do {
      auVar29 = *(undefined1 (*) [16])(this->tiles_ + lVar28);
      auVar31[1] = 0;
      auVar31[0] = auVar29[8];
      auVar31[2] = auVar29[9];
      auVar31[3] = 0;
      auVar31[4] = auVar29[10];
      auVar31[5] = 0;
      auVar31[6] = auVar29[0xb];
      auVar31[7] = 0;
      auVar31[8] = auVar29[0xc];
      auVar31[9] = 0;
      auVar31[10] = auVar29[0xd];
      auVar31[0xb] = 0;
      auVar31[0xc] = auVar29[0xe];
      auVar31[0xd] = 0;
      auVar31[0xe] = auVar29[0xf];
      auVar31[0xf] = 0;
      auVar30 = pshuflw(auVar31,auVar31,0x1b);
      auVar31 = pshufhw(auVar30,auVar30,0x1b);
      auVar18[0xd] = 0;
      auVar18._0_13_ = auVar29._0_13_;
      auVar18[0xe] = auVar29[7];
      auVar19[0xc] = auVar29[6];
      auVar19._0_12_ = auVar29._0_12_;
      auVar19._13_2_ = auVar18._13_2_;
      auVar20[0xb] = 0;
      auVar20._0_11_ = auVar29._0_11_;
      auVar20._12_3_ = auVar19._12_3_;
      auVar21[10] = auVar29[5];
      auVar21._0_10_ = auVar29._0_10_;
      auVar21._11_4_ = auVar20._11_4_;
      auVar22[9] = 0;
      auVar22._0_9_ = auVar29._0_9_;
      auVar22._10_5_ = auVar21._10_5_;
      auVar23[8] = auVar29[4];
      auVar23._0_8_ = auVar29._0_8_;
      auVar23._9_6_ = auVar22._9_6_;
      auVar24._7_8_ = 0;
      auVar24._0_7_ = auVar23._8_7_;
      auVar25._1_8_ = SUB158(auVar24 << 0x40,7);
      auVar25[0] = auVar29[3];
      auVar25._9_6_ = 0;
      auVar26._1_10_ = SUB1510(auVar25 << 0x30,5);
      auVar26[0] = auVar29[2];
      auVar26._11_4_ = 0;
      auVar30._3_12_ = SUB1512(auVar26 << 0x20,3);
      auVar30[2] = auVar29[1];
      auVar30[0] = auVar29[0];
      auVar30[1] = 0;
      auVar30[0xf] = 0;
      auVar29 = pshuflw(auVar30,auVar30,0x1b);
      auVar29 = pshufhw(auVar29,auVar29,0x1b);
      sVar2 = auVar29._0_2_;
      sVar3 = auVar29._2_2_;
      sVar4 = auVar29._4_2_;
      sVar5 = auVar29._6_2_;
      sVar6 = auVar29._8_2_;
      sVar7 = auVar29._10_2_;
      sVar8 = auVar29._12_2_;
      sVar9 = auVar29._14_2_;
      sVar10 = auVar31._0_2_;
      sVar11 = auVar31._2_2_;
      sVar12 = auVar31._4_2_;
      sVar13 = auVar31._6_2_;
      sVar14 = auVar31._8_2_;
      sVar15 = auVar31._10_2_;
      sVar16 = auVar31._12_2_;
      sVar17 = auVar31._14_2_;
      pcVar1 = __s + lVar28 * 4;
      *pcVar1 = (0 < sVar2) * (sVar2 < 0x100) * auVar29[0] - (0xff < sVar2);
      pcVar1[1] = (0 < sVar3) * (sVar3 < 0x100) * auVar29[2] - (0xff < sVar3);
      pcVar1[2] = (0 < sVar4) * (sVar4 < 0x100) * auVar29[4] - (0xff < sVar4);
      pcVar1[3] = (0 < sVar5) * (sVar5 < 0x100) * auVar29[6] - (0xff < sVar5);
      pcVar1[4] = (0 < sVar6) * (sVar6 < 0x100) * auVar29[8] - (0xff < sVar6);
      pcVar1[5] = (0 < sVar7) * (sVar7 < 0x100) * auVar29[10] - (0xff < sVar7);
      pcVar1[6] = (0 < sVar8) * (sVar8 < 0x100) * auVar29[0xc] - (0xff < sVar8);
      pcVar1[7] = (0 < sVar9) * (sVar9 < 0x100) * auVar29[0xe] - (0xff < sVar9);
      pcVar1[8] = (0 < sVar10) * (sVar10 < 0x100) * auVar31[0] - (0xff < sVar10);
      pcVar1[9] = (0 < sVar11) * (sVar11 < 0x100) * auVar31[2] - (0xff < sVar11);
      pcVar1[10] = (0 < sVar12) * (sVar12 < 0x100) * auVar31[4] - (0xff < sVar12);
      pcVar1[0xb] = (0 < sVar13) * (sVar13 < 0x100) * auVar31[6] - (0xff < sVar13);
      pcVar1[0xc] = (0 < sVar14) * (sVar14 < 0x100) * auVar31[8] - (0xff < sVar14);
      pcVar1[0xd] = (0 < sVar15) * (sVar15 < 0x100) * auVar31[10] - (0xff < sVar15);
      pcVar1[0xe] = (0 < sVar16) * (sVar16 < 0x100) * auVar31[0xc] - (0xff < sVar16);
      pcVar1[0xf] = (0 < sVar17) * (sVar17 < 0x100) * auVar31[0xe] - (0xff < sVar17);
      lVar28 = lVar28 + 4;
    } while (lVar28 != 0x400);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<char> Chunk::serialize() const {
    if (isEmpty()) {
        return {};
    }
    std::vector<char> data(sizeof(tiles_));
    for (unsigned int i = 0; i < WIDTH * WIDTH; ++i) {
        // FIXME: it may be just as efficient to create tileSwapped with bitwise ops instead of relying on a fragile reinterpret cast (which could be platform dependent).
        uint32_t tileSwapped = FileStorage::byteswap(*reinterpret_cast<const uint32_t*>(tiles_ + i));
        std::memcpy(data.data() + i * sizeof(TileData), &tileSwapped, sizeof(TileData));
    }
    return data;
}